

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

istream * operator>>(istream *stream,Msk4Header *header)

{
  value_type_conflict4 vVar1;
  int iVar2;
  value_type_conflict3 vVar3;
  runtime_error *this;
  value_type_conflict4 *in_RSI;
  istream *in_RDI;
  Msk4HeaderSwitch h;
  int version;
  istream *in_stack_ffffffffffffffc0;
  istream *in_stack_ffffffffffffffd8;
  
  iVar2 = detectSwitch(in_stack_ffffffffffffffd8);
  if (iVar2 < 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"PS3 MSK4 decoding is unsupported");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  readRaw<Msk4HeaderSwitch>(in_stack_ffffffffffffffc0);
  vVar1 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x117382);
  *in_RSI = vVar1;
  vVar1 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11739b);
  in_RSI[1] = vVar1;
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x1173b5);
  *(value_type_conflict3 *)(in_RSI + 2) = vVar3;
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x1173cd);
  *(value_type_conflict3 *)(in_RSI + 4) = vVar3;
  return in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& stream, Msk4Header& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		throw std::runtime_error("PS3 MSK4 decoding is unsupported");
	} else { // Switch
		auto h = readRaw<Msk4HeaderSwitch>(stream);
		header.width = h.width.value();
		header.height = h.height.value();
		header.dataOffset = h.dataOffset.value();
		header.dataSize = h.dataSize.value();
	}
	return stream;
}